

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool art_node_init_iterator(art_ref_t ref,art_iterator_t *iterator,_Bool first)

{
  byte bVar1;
  unkbyte9 Var2;
  _Bool _Var3;
  ulong uVar4;
  art_node_t *node;
  art_typecode_t typecode;
  art_indexed_child_t aVar5;
  
  while( true ) {
    if ((ref & 0xff) == 1) break;
    uVar4 = (ulong)(uint)((int)(ref & 0xff) << 3);
    node = (art_node_t *)
           ((ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar4) +
           *(long *)((long)iterator->art->nodes + uVar4));
    if (first) {
      aVar5 = art_node_next_child(node,(art_typecode_t)ref,-1);
      Var2 = aVar5._0_9_;
    }
    else {
      aVar5 = art_node_prev_child(node,(art_typecode_t)ref,0x100);
      Var2 = aVar5._0_9_;
    }
    art_iterator_down(iterator,ref,(uint8_t)((unkuint9)Var2 >> 0x40));
    ref = (ulong)Var2;
  }
  bVar1 = iterator->frame;
  iterator->frames[bVar1].ref = ref;
  iterator->frames[bVar1].index_in_node = '\0';
  _Var3 = art_iterator_valid_loc(iterator,ref);
  return _Var3;
}

Assistant:

static bool art_node_init_iterator(art_ref_t ref, art_iterator_t *iterator,
                                   bool first) {
    while (!art_is_leaf(ref)) {
        art_node_t *node = art_deref(iterator->art, ref);
        art_indexed_child_t indexed_child;
        if (first) {
            indexed_child =
                art_node_next_child(node, art_ref_typecode(ref), -1);
        } else {
            indexed_child =
                art_node_prev_child(node, art_ref_typecode(ref), 256);
        }
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    // We're at a leaf.
    iterator->frames[iterator->frame].ref = ref;
    iterator->frames[iterator->frame].index_in_node = 0;  // Should not matter.
    return art_iterator_valid_loc(iterator, ref);
}